

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O0

void __thiscall
ThreadContext::SetReturnedValueList(ThreadContext *this,ReturnedValueList *returnedValueList)

{
  code *pcVar1;
  bool bVar2;
  RecyclableData *pRVar3;
  undefined4 *puVar4;
  ReturnedValueList *returnedValueList_local;
  ThreadContext *this_local;
  
  pRVar3 = Memory::RecyclerRootPtr::operator_cast_to_RecyclableData_
                     ((RecyclerRootPtr *)&this->recyclableData);
  if (pRVar3 == (RecyclableData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/ThreadContext.h"
                       ,0x3d1,"(this->recyclableData != nullptr)","this->recyclableData != nullptr")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::operator=(&pRVar3->returnedValueList,returnedValueList);
  return;
}

Assistant:

void SetReturnedValueList(Js::ReturnedValueList *returnedValueList)
    {
        Assert(this->recyclableData != nullptr);
        this->recyclableData->returnedValueList = returnedValueList;
    }